

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O0

void skiwi::anon_unknown_2::inline_vector_length(PrimitiveCall *p,Expression *e)

{
  byte bVar1;
  byte bVar2;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Expression *local_18;
  Expression *e_local;
  PrimitiveCall *p_local;
  
  bVar1 = (anonymous_namespace)::g_safe_primitives;
  bVar2 = (anonymous_namespace)::g_standard_bindings ^ 1;
  local_18 = e;
  e_local = (Expression *)p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"vector-length",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"##vector-length",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"##vector?",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  make_inline_procedure
            (p,e,1,(bool)(bVar2 & 1),(bool)(bVar1 & 1),&local_38,&local_70,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void inline_vector_length(PrimitiveCall& p, Expression& e)
    {
    make_inline_procedure(p, e, 1, !g_standard_bindings, g_safe_primitives, "vector-length", "##vector-length", "##vector?");
    }